

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_encode_utils.cpp
# Opt level: O0

string * encode_compute_hmac_sha1
                   (string *__return_storage_ptr__,string *access_key,char *buf_in,int len_buf_in)

{
  mbedtls_md_info_t *md_info;
  uchar *key;
  size_t keylen;
  allocator<char> local_271;
  size_t local_270;
  size_t output_len;
  char encoded [512];
  char output [20];
  mbedtls_md_info_t *sha1_md;
  mbedtls_md_context_t ctx;
  int res;
  int len_buf_in_local;
  char *buf_in_local;
  string *access_key_local;
  
  sha1_md = (mbedtls_md_info_t *)0x0;
  ctx.md_info = (mbedtls_md_info_t *)0x0;
  ctx.md_ctx = (void *)0x0;
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  mbedtls_md_init_ctx((mbedtls_md_context_t *)&sha1_md,md_info);
  encoded[0x1f8] = '\0';
  encoded[0x1f9] = '\0';
  encoded[0x1fa] = '\0';
  encoded[0x1fb] = '\0';
  encoded[0x1fc] = '\0';
  encoded[0x1fd] = '\0';
  encoded[0x1fe] = '\0';
  encoded[0x1ff] = '\0';
  memset(&output_len,0,0x200);
  key = (uchar *)std::__cxx11::string::c_str();
  keylen = std::__cxx11::string::size();
  mbedtls_md_hmac_starts((mbedtls_md_context_t *)&sha1_md,key,keylen);
  mbedtls_md_hmac_update((mbedtls_md_context_t *)&sha1_md,(uchar *)buf_in,(long)len_buf_in);
  mbedtls_md_hmac_finish((mbedtls_md_context_t *)&sha1_md,(uchar *)(encoded + 0x1f8));
  local_270 = 0;
  mbedtls_base64_encode((uchar *)&output_len,0x200,&local_270,(uchar *)(encoded + 0x1f8),0x14);
  mbedtls_md_free((mbedtls_md_context_t *)&sha1_md);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&output_len,&local_271);
  std::allocator<char>::~allocator(&local_271);
  return __return_storage_ptr__;
}

Assistant:

std::string encode_compute_hmac_sha1(std::string access_key, char* buf_in, int len_buf_in) {
  int res = 0;

  mbedtls_md_context_t ctx= {};
  const mbedtls_md_info_t * sha1_md = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  mbedtls_md_init_ctx(&ctx, sha1_md);
  char output[20] = {};
  char encoded[512] = {};
  
  res = mbedtls_md_hmac_starts(&ctx, (const unsigned char*)access_key.c_str(), access_key.size());
  res = mbedtls_md_hmac_update(&ctx, (const unsigned char*)buf_in, len_buf_in);
  res = mbedtls_md_hmac_finish(&ctx, (unsigned char*)output);

  size_t output_len = 0;
  mbedtls_base64_encode((unsigned char*)encoded, sizeof(encoded), &output_len, (const unsigned char*)output, 20);
  mbedtls_md_free(&ctx);
  return encoded;
}